

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_dirent.c
# Opt level: O3

_Bool zip_dirent_process_ef_zip64
                (zip_dirent_t *zde,zip_uint8_t *ef,zip_uint64_t got_len,_Bool local,
                zip_error_t *error)

{
  _Bool _Var1;
  zip_uint32_t zVar2;
  zip_uint32_t zVar3;
  zip_buffer_t *buffer;
  zip_uint64_t zVar4;
  zip_uint64_t zVar5;
  bool bVar6;
  
  buffer = _zip_buffer_new(ef,got_len);
  if (buffer == (zip_buffer_t *)0x0) {
    zip_error_set(error,0xe,0);
    return false;
  }
  if (zde->uncomp_size == 0xffffffff) {
    zVar4 = _zip_buffer_get_64(buffer);
    zde->uncomp_size = zVar4;
  }
  else if (local) {
    _zip_buffer_skip(buffer,8);
  }
  if (zde->comp_size == 0xffffffff) {
    zVar4 = _zip_buffer_get_64(buffer);
    zde->comp_size = zVar4;
  }
  if (!local) {
    if (zde->offset == 0xffffffff) {
      zVar4 = _zip_buffer_get_64(buffer);
      zde->offset = zVar4;
    }
    if (zde->disk_number == 0xffff) {
      zVar2 = _zip_buffer_get_32(buffer);
      zde->disk_number = zVar2;
    }
  }
  _Var1 = _zip_buffer_eof(buffer);
  if (_Var1) {
LAB_00108b73:
    _zip_buffer_free(buffer);
    _Var1 = true;
  }
  else {
    if (got_len == 0x18) {
      bVar6 = false;
LAB_00108bb2:
      _zip_buffer_set_offset(buffer,0);
      zVar4 = zde->uncomp_size;
      zVar5 = _zip_buffer_get_64(buffer);
      if (((zVar4 == zVar5) &&
          (zVar4 = zde->comp_size, zVar5 = _zip_buffer_get_64(buffer), zVar4 == zVar5)) &&
         (zVar4 = zde->offset, zVar5 = _zip_buffer_get_64(buffer), zVar4 == zVar5 && !bVar6))
      goto LAB_00108b73;
    }
    else if (got_len == 0x1c) {
      _zip_buffer_set_offset(buffer,0x18);
      zVar2 = zde->disk_number;
      zVar3 = _zip_buffer_get_32(buffer);
      bVar6 = zVar2 != zVar3;
      goto LAB_00108bb2;
    }
    zip_error_set(error,0x15,0xf);
    _zip_buffer_free(buffer);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
zip_dirent_process_ef_zip64(zip_dirent_t *zde, const zip_uint8_t *ef, zip_uint64_t got_len, bool local, zip_error_t *error) {
    zip_buffer_t *ef_buffer;

    if ((ef_buffer = _zip_buffer_new((zip_uint8_t *)ef, got_len)) == NULL) {
        zip_error_set(error, ZIP_ER_MEMORY, 0);
        return false;
    }

    if (zde->uncomp_size == ZIP_UINT32_MAX) {
        zde->uncomp_size = _zip_buffer_get_64(ef_buffer);
    }
    else if (local) {
        /* From appnote.txt: This entry in the Local header MUST
           include BOTH original and compressed file size fields. */
        (void)_zip_buffer_skip(ef_buffer, 8); /* error is caught by _zip_buffer_eof() call */
    }
    if (zde->comp_size == ZIP_UINT32_MAX) {
        zde->comp_size = _zip_buffer_get_64(ef_buffer);
    }
    if (!local) {
        if (zde->offset == ZIP_UINT32_MAX) {
            zde->offset = _zip_buffer_get_64(ef_buffer);
        }
        if (zde->disk_number == ZIP_UINT16_MAX) {
            zde->disk_number = _zip_buffer_get_32(ef_buffer);
        }
    }

    if (!_zip_buffer_eof(ef_buffer)) {
        /* accept additional fields if values match */
        bool ok = true;
        switch (got_len) {
        case 28:
            _zip_buffer_set_offset(ef_buffer, 24);
            if (zde->disk_number != _zip_buffer_get_32(ef_buffer)) {
                ok = false;
            }
            /* fallthrough */
        case 24:
            _zip_buffer_set_offset(ef_buffer, 0);
            if ((zde->uncomp_size != _zip_buffer_get_64(ef_buffer)) || (zde->comp_size != _zip_buffer_get_64(ef_buffer)) || (zde->offset != _zip_buffer_get_64(ef_buffer))) {
                ok = false;
            }
            break;

        default:
            ok = false;
        }
        if (!ok) {
            zip_error_set(error, ZIP_ER_INCONS, ZIP_ER_DETAIL_INVALID_ZIP64_EF);
            _zip_buffer_free(ef_buffer);
            return false;
        }
    }
    _zip_buffer_free(ef_buffer);

    return true;
}